

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O1

ssize_t __thiscall kj::FdOutputStream::write(FdOutputStream *this,int __fd,void *__buf,size_t __n)

{
  int code;
  ssize_t in_RAX;
  ssize_t sVar1;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  void *__buf_00;
  Fault f;
  Fault local_30;
  
  __buf_00 = (void *)CONCAT44(in_register_00000034,__fd);
  if (__buf != (void *)0x0) {
LAB_002ad5fa:
    do {
      sVar1 = ::write(this->fd,__buf_00,(size_t)__buf);
      if (sVar1 < 0) {
        code = _::Debug::getOsErrorNumber(false);
        in_RAX = CONCAT44(extraout_var,code);
        if (code == -1) goto LAB_002ad5fa;
      }
      else {
        code = 0;
        in_RAX = sVar1;
      }
      if (code != 0) {
        _::Debug::Fault::Fault<int,int&>
                  (&local_30,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/io.c++"
                   ,0x16e,code,"n = miniposix::write(fd, pos, size)","fd",&this->fd);
        _::Debug::Fault::fatal(&local_30);
      }
      if (sVar1 < 1) {
        _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[23]>
                  (&local_30,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/io.c++"
                   ,0x16f,FAILED,"n > 0","\"write() returned zero.\"",
                   (char (*) [23])"write() returned zero.");
        _::Debug::Fault::fatal(&local_30);
      }
      __buf_00 = (void *)((long)__buf_00 + sVar1);
      __buf = (void *)((long)__buf - sVar1);
    } while (__buf != (void *)0x0);
  }
  return in_RAX;
}

Assistant:

void FdOutputStream::write(const void* buffer, size_t size) {
  const char* pos = reinterpret_cast<const char*>(buffer);

  while (size > 0) {
    miniposix::ssize_t n;
    KJ_SYSCALL(n = miniposix::write(fd, pos, size), fd);
    KJ_ASSERT(n > 0, "write() returned zero.");
    pos += n;
    size -= n;
  }
}